

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
copy_or_move_from<google::dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
          (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *ht,size_type min_buckets_wanted)

{
  int iVar1;
  size_type new_num_buckets;
  ulong uVar2;
  int iVar3;
  long lVar4;
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *__range3;
  iterator __end0;
  iterator __begin0;
  iterator iStack_48;
  iterator local_30;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear_to_size((dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)this,new_num_buckets);
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(&local_30,ht);
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::end(&iStack_48,ht);
  while (local_30.pos != iStack_48.pos) {
    uVar2 = (ulong)*local_30.pos;
    *(int *)(this + 4) = *(int *)(this + 4) + 1;
    iVar3 = *(int *)(this + 0x38);
    lVar4 = 0;
    while( true ) {
      iVar3 = iVar3 + 1;
      uVar2 = uVar2 & *(long *)(this + 0x58) - 1U;
      iVar1 = *(int *)(*(long *)(this + 0x70) + uVar2 * 4);
      *(int *)(this + 0x38) = iVar3;
      if (*(int *)(this + 0x40) == iVar1) break;
      uVar2 = uVar2 + lVar4 + 1;
      lVar4 = lVar4 + 1;
    }
    *(int *)(*(long *)(this + 0x70) + uVar2 * 4) = *local_30.pos;
    *(long *)(this + 0x50) = *(long *)(this + 0x50) + 1;
    dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }